

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_map_add_keypath_item
              (wally_map *map_in,uchar *pub_key,size_t pub_key_len,uchar *fingerprint,
              size_t fingerprint_len,uint32_t *path,size_t path_len)

{
  int iVar1;
  leint32_t lVar2;
  size_t size;
  uchar *value_00;
  leint32_t tmp;
  int ret;
  size_t i;
  size_t value_len;
  uchar *value;
  uint32_t *path_local;
  size_t fingerprint_len_local;
  uchar *fingerprint_local;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  wally_map *map_in_local;
  
  if ((((map_in == (wally_map *)0x0) ||
       (iVar1 = wally_ec_public_key_verify(pub_key,pub_key_len), iVar1 != 0)) ||
      (fingerprint == (uchar *)0x0)) ||
     ((fingerprint_len != 4 || ((path != (uint32_t *)0x0) != (path_len != 0))))) {
    map_in_local._4_4_ = -2;
  }
  else {
    size = path_len * 4 + 4;
    value_00 = (uchar *)wally_malloc(size);
    if (value_00 == (uchar *)0x0) {
      map_in_local._4_4_ = -3;
    }
    else {
      memcpy(value_00,fingerprint,4);
      for (_tmp = 0; _tmp < path_len; _tmp = _tmp + 1) {
        lVar2 = cpu_to_le32(path[_tmp]);
        *(leint32_t *)(value_00 + _tmp * 4 + 4) = lVar2;
      }
      map_in_local._4_4_ =
           map_add(map_in,pub_key,pub_key_len,value_00,size,true,(_func_int_uchar_ptr_size_t *)0x0,
                   true);
      if (map_in_local._4_4_ != 0) {
        clear_and_free(value_00,size);
      }
    }
  }
  return map_in_local._4_4_;
}

Assistant:

int wally_map_add_keypath_item(struct wally_map *map_in,
                               const unsigned char *pub_key, size_t pub_key_len,
                               const unsigned char *fingerprint, size_t fingerprint_len,
                               const uint32_t *path, size_t path_len)
{
    unsigned char *value;
    size_t value_len, i;
    int ret;

    if (!map_in ||
        (wally_ec_public_key_verify(pub_key, pub_key_len) != WALLY_OK) ||
        !fingerprint || fingerprint_len != BIP32_KEY_FINGERPRINT_LEN ||
        BYTES_INVALID(path, path_len))
        return WALLY_EINVAL;

    value_len = fingerprint_len + path_len * sizeof(uint32_t);
    if (!(value = wally_malloc(value_len)))
        return WALLY_ENOMEM;

    memcpy(value, fingerprint, fingerprint_len);
    for (i = 0; i < path_len; ++i) {
        leint32_t tmp = cpu_to_le32(path[i]);
        memcpy(value + fingerprint_len + i * sizeof(uint32_t),
               &tmp, sizeof(tmp));
    }

    ret = map_add(map_in, pub_key, pub_key_len, value, value_len, true, NULL, true);
    if (ret != WALLY_OK)
        clear_and_free(value, value_len);
    return ret;
}